

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.hpp
# Opt level: O2

void __thiscall
sp::template_classifier::create_templates(template_classifier *this,string *g_loc,string *b_loc)

{
  container_t ret;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_48;
  container_t local_30;
  
  local_48.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  make_templates_(&local_30,this,g_loc);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::_M_move_assign(&this->good_templates,&local_30);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_30);
  make_templates_(&local_30,this,b_loc);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::_M_move_assign(&this->bad_templates,&local_30);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_30);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_48);
  return;
}

Assistant:

inline void create_templates(const std::string& g_loc, const std::string& b_loc)
	{
		container_t ret;
		good_templates = make_templates_(g_loc);
		bad_templates  = make_templates_(b_loc);
	}